

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3-prov.c
# Opt level: O3

void * blake3_dupctx(void *vctx)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)
           CRYPTO_zalloc(0x788,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/src/blake3-prov.c"
                         ,0x1b);
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = 0;
    puVar1[1] = 0;
    *puVar1 = *vctx;
    puVar1[1] = *(undefined8 *)((long)vctx + 8);
  }
  return puVar1;
}

Assistant:

static void *blake3_dupctx(void *vctx)
{
	struct blake3_ctx *src = vctx;
	struct blake3_ctx *dst = NULL;

	dst = blake3_newctx(NULL);

	if (dst == NULL) {
		return NULL;
	}

	dst->prov = src->prov;
	dst->out_len = src->out_len;

	return dst;
}